

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall
GdlUnaryExpression::ResolveToInteger(GdlUnaryExpression *this,int *pnRet,bool fSlotRef)

{
  GrcSymbolTableEntry *pGVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  int nTmp;
  int local_74;
  string local_70;
  string local_50;
  
  iVar3 = (*this->m_pexpOperand->_vptr_GdlExpression[7])
                    (this->m_pexpOperand,&local_74,CONCAT71(in_register_00000011,fSlotRef));
  if ((char)iVar3 == '\0') {
    bVar2 = false;
  }
  else {
    pGVar1 = this->m_psymOperator;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"!","");
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      uVar4 = (uint)(local_74 == 0);
    }
    else {
      pGVar1 = this->m_psymOperator;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-","");
      bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return false;
      }
      uVar4 = -local_74;
    }
    *pnRet = uVar4;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool GdlUnaryExpression::ResolveToInteger(int * pnRet, bool fSlotRef)
{

	int nTmp;
	if (!m_pexpOperand->ResolveToInteger(&nTmp, fSlotRef))
		return false;

	if (m_psymOperator->MatchesOp("!"))
		*pnRet = (nTmp == 0)? 1: 0;
	else if (m_psymOperator->MatchesOp("-"))
		*pnRet = nTmp * -1;
	else
		return false;

	return true;
}